

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeSetPrototype
               (DynamicObject *setPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar4;
  RuntimeFunction *pRVar2;
  StaticType *type;
  LiteralString *pLVar3;
  ulong uVar5;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,setPrototype,mode,0xc,1);
  this = (((setPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar4 << 0x20;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (setPrototype,0x67,(this->super_JavascriptLibraryBase).setConstructor.ptr,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::Add,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x4a);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x4a,pRVar2,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::Clear,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x62);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x62,pRVar2,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::Delete,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x6f);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x6f,pRVar2,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::ForEach,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x93);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x93,pRVar2,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::Has,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xb4);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0xb4,pRVar2,6,0,0,uVar5);
  pRVar2 = CreateGetterFunction(this,0x14f,(FunctionInfo *)JavascriptSet::EntryInfo::SizeGetter);
  if (pRVar2 == (RuntimeFunction *)0x0) {
    pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(setPrototype,0x14f,pRVar2);
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(setPrototype,0x14f,6);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::Entries,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x7a);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x7a,pRVar2,6,0,0,uVar5);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSet::EntryInfo::Values,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,399);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,399,pRVar2,6,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0xcf,pRVar2,6,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x14,pRVar2,6,0,0,uVar5);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar3 = LiteralString::New(type,L"Set",3,this->recycler);
    (*(setPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(setPrototype,0x1b,pLVar3,2,0,0,uVar5 & 0xffffffff00000000)
    ;
  }
  DynamicObject::SetHasNoEnumerableProperties(setPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSetPrototype(DynamicObject* setPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(setPrototype, mode, 12, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSet
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = setPrototype->GetScriptContext();
        JavascriptLibrary* library = setPrototype->GetLibrary();
        library->AddMember(setPrototype, PropertyIds::constructor, library->setConstructor);

        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::add, &JavascriptSet::EntryInfo::Add, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::clear, &JavascriptSet::EntryInfo::Clear, 0);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::delete_, &JavascriptSet::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::forEach, &JavascriptSet::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::has, &JavascriptSet::EntryInfo::Has, 1);

        library->AddAccessorsToLibraryObject(setPrototype, PropertyIds::size, &JavascriptSet::EntryInfo::SizeGetter, nullptr);

        JavascriptFunction* valuesFunc;
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::entries, &JavascriptSet::EntryInfo::Entries, 0);
        valuesFunc = library->AddFunctionToLibraryObject(setPrototype, PropertyIds::values, &JavascriptSet::EntryInfo::Values, 0);
        library->AddMember(setPrototype, PropertyIds::keys, valuesFunc);
        library->AddMember(setPrototype, PropertyIds::_symbolIterator, valuesFunc);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(setPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Set")), PropertyConfigurable);
        }

        setPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }